

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

void __thiscall
ObjectTest_basic_value_constructor_Test::TestBody(ObjectTest_basic_value_constructor_Test *this)

{
  long lVar1;
  longdouble lVar2;
  anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
  *paVar3;
  long *plVar4;
  anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
  *paVar5;
  pointer *ppoVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  undefined1 *puVar8;
  ulong uVar9;
  internal iVar10;
  undefined6 uVar11;
  undefined1 uVar12;
  Message MVar13;
  undefined1 uVar14;
  undefined2 uVar15;
  undefined4 uVar16;
  AssertHelper AVar17;
  undefined1 uVar18;
  undefined2 uVar19;
  undefined4 uVar20;
  char *pcVar21;
  pointer *__ptr;
  object test_object__;
  undefined1 local_e8 [8];
  undefined7 uStack_e0;
  undefined1 uStack_d9;
  anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
  local_d8;
  undefined1 local_c8 [8];
  undefined2 uStack_c0;
  undefined5 uStack_be;
  undefined1 uStack_b9;
  pointer local_b8;
  undefined8 uStack_b0;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_a8;
  internal local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  _Variadic_union<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  local_78;
  char local_48;
  
  local_78._M_rest._0_1_ = (undefined1)false;
  local_48 = 1;
  local_c8[0] = (Message)0x0;
  local_a8._M_dataplus._M_p._0_1_ = (AssertHelper)0x0;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)local_e8,"test_object__.get< bool >()","bool {}",(bool *)local_c8,
             (bool *)&local_a8);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if ((undefined8 *)CONCAT17(uStack_d9,uStack_e0) == (undefined8 *)0x0) {
      pcVar21 = "";
    }
    else {
      pcVar21 = *(char **)CONCAT17(uStack_d9,uStack_e0);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x157,pcVar21);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    plVar4 = (long *)CONCAT44(local_c8._4_4_,
                              CONCAT22(local_c8._2_2_,CONCAT11(local_c8[1],local_c8[0])));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT17(uStack_d9,uStack_e0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uStack_d9,uStack_e0));
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&local_78._M_first);
  local_78._M_rest._0_1_ = (undefined1)false;
  local_78._1_7_ = 0;
  local_48 = 2;
  local_c8[0] = (Message)0x0;
  local_a8._M_dataplus._M_p._0_1_ = (AssertHelper)0x0;
  testing::internal::CmpHelperEQ<signed_char,signed_char>
            ((internal *)local_e8,"test_object__.get< signed_char_t >()","signed_char_t {}",local_c8
             ,(char *)&local_a8);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if ((undefined8 *)CONCAT17(uStack_d9,uStack_e0) == (undefined8 *)0x0) {
      pcVar21 = "";
    }
    else {
      pcVar21 = *(char **)CONCAT17(uStack_d9,uStack_e0);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x158,pcVar21);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    plVar4 = (long *)CONCAT44(local_c8._4_4_,
                              CONCAT22(local_c8._2_2_,CONCAT11(local_c8[1],local_c8[0])));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT17(uStack_d9,uStack_e0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uStack_d9,uStack_e0));
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&local_78._M_first);
  local_78._M_rest._0_1_ = (undefined1)false;
  local_78._1_7_ = 0;
  local_48 = 2;
  local_c8[0] = (Message)0x0;
  local_a8._M_dataplus._M_p._0_1_ = (AssertHelper)0x0;
  testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
            ((internal *)local_e8,"test_object__.get< unsigned_char_t >()","unsigned_char_t {}",
             local_c8,(uchar *)&local_a8);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if ((undefined8 *)CONCAT17(uStack_d9,uStack_e0) == (undefined8 *)0x0) {
      pcVar21 = "";
    }
    else {
      pcVar21 = *(char **)CONCAT17(uStack_d9,uStack_e0);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x159,pcVar21);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    plVar4 = (long *)CONCAT44(local_c8._4_4_,
                              CONCAT22(local_c8._2_2_,CONCAT11(local_c8[1],local_c8[0])));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT17(uStack_d9,uStack_e0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uStack_d9,uStack_e0));
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&local_78._M_first);
  local_78._M_rest._0_1_ = (undefined1)false;
  local_78._1_7_ = 0;
  local_48 = 2;
  local_c8[0] = (Message)0x0;
  local_c8[1] = 0;
  local_a8._M_dataplus._M_p._0_1_ = (AssertHelper)0x0;
  local_a8._M_dataplus._M_p._1_1_ = 0;
  testing::internal::CmpHelperEQ<short,short>
            ((internal *)local_e8,"test_object__.get< short >()","short {}",(short *)local_c8,
             (short *)&local_a8);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if ((undefined8 *)CONCAT17(uStack_d9,uStack_e0) == (undefined8 *)0x0) {
      pcVar21 = "";
    }
    else {
      pcVar21 = *(char **)CONCAT17(uStack_d9,uStack_e0);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x15a,pcVar21);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    plVar4 = (long *)CONCAT44(local_c8._4_4_,
                              CONCAT22(local_c8._2_2_,CONCAT11(local_c8[1],local_c8[0])));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT17(uStack_d9,uStack_e0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uStack_d9,uStack_e0));
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&local_78._M_first);
  local_78._M_rest._0_1_ = (undefined1)false;
  local_78._1_7_ = 0;
  local_48 = 2;
  local_c8[0] = (Message)0x0;
  local_c8[1] = 0;
  local_c8._2_2_ = 0;
  local_a8._M_dataplus._M_p._0_1_ = (AssertHelper)0x0;
  local_a8._M_dataplus._M_p._1_1_ = 0;
  local_a8._M_dataplus._M_p._2_2_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_e8,"test_object__.get< int >()","int {}",(int *)local_c8,
             (int *)&local_a8);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if ((undefined8 *)CONCAT17(uStack_d9,uStack_e0) == (undefined8 *)0x0) {
      pcVar21 = "";
    }
    else {
      pcVar21 = *(char **)CONCAT17(uStack_d9,uStack_e0);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x15b,pcVar21);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    plVar4 = (long *)CONCAT44(local_c8._4_4_,
                              CONCAT22(local_c8._2_2_,CONCAT11(local_c8[1],local_c8[0])));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT17(uStack_d9,uStack_e0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uStack_d9,uStack_e0));
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&local_78._M_first);
  local_78._M_rest._0_1_ = (undefined1)false;
  local_78._1_7_ = 0;
  local_48 = 2;
  local_c8[0] = (Message)0x0;
  local_c8[1] = 0;
  local_c8._2_2_ = 0;
  local_c8._4_4_ = 0;
  local_a8._M_dataplus._M_p._0_1_ = (AssertHelper)0x0;
  local_a8._M_dataplus._M_p._1_1_ = 0;
  local_a8._M_dataplus._M_p._2_2_ = 0;
  local_a8._M_dataplus._M_p._4_4_ = 0;
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_e8,"test_object__.get< long >()","long {}",(long *)local_c8,
             (long *)&local_a8);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if ((undefined8 *)CONCAT17(uStack_d9,uStack_e0) == (undefined8 *)0x0) {
      pcVar21 = "";
    }
    else {
      pcVar21 = *(char **)CONCAT17(uStack_d9,uStack_e0);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x15c,pcVar21);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    plVar4 = (long *)CONCAT44(local_c8._4_4_,
                              CONCAT22(local_c8._2_2_,CONCAT11(local_c8[1],local_c8[0])));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT17(uStack_d9,uStack_e0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uStack_d9,uStack_e0));
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&local_78._M_first);
  local_78._M_rest._0_1_ = (undefined1)false;
  local_78._1_7_ = 0;
  local_48 = 2;
  local_c8[0] = (Message)0x0;
  local_c8[1] = 0;
  local_c8._2_2_ = 0;
  local_c8._4_4_ = 0;
  local_a8._M_dataplus._M_p._0_1_ = (AssertHelper)0x0;
  local_a8._M_dataplus._M_p._1_1_ = 0;
  local_a8._M_dataplus._M_p._2_2_ = 0;
  local_a8._M_dataplus._M_p._4_4_ = 0;
  testing::internal::CmpHelperEQ<long_long,long_long>
            ((internal *)local_e8,"test_object__.get< long_long_t >()","long_long_t {}",
             (longlong *)local_c8,(longlong *)&local_a8);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if ((undefined8 *)CONCAT17(uStack_d9,uStack_e0) == (undefined8 *)0x0) {
      pcVar21 = "";
    }
    else {
      pcVar21 = *(char **)CONCAT17(uStack_d9,uStack_e0);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x15d,pcVar21);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    plVar4 = (long *)CONCAT44(local_c8._4_4_,
                              CONCAT22(local_c8._2_2_,CONCAT11(local_c8[1],local_c8[0])));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT17(uStack_d9,uStack_e0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uStack_d9,uStack_e0));
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&local_78._M_first);
  local_78._M_rest._0_1_ = (undefined1)false;
  local_78._1_7_ = 0;
  local_48 = 2;
  local_c8[0] = (Message)0x0;
  local_c8[1] = 0;
  local_c8._2_2_ = 0;
  local_c8._4_4_ = 0;
  local_a8._M_dataplus._M_p._0_1_ = (AssertHelper)0x0;
  local_a8._M_dataplus._M_p._1_1_ = 0;
  local_a8._M_dataplus._M_p._2_2_ = 0;
  local_a8._M_dataplus._M_p._4_4_ = 0;
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_e8,"test_object__.get< intmax_t >()","intmax_t {}",(long *)local_c8,
             (long *)&local_a8);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if ((undefined8 *)CONCAT17(uStack_d9,uStack_e0) == (undefined8 *)0x0) {
      pcVar21 = "";
    }
    else {
      pcVar21 = *(char **)CONCAT17(uStack_d9,uStack_e0);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x15e,pcVar21);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    plVar4 = (long *)CONCAT44(local_c8._4_4_,
                              CONCAT22(local_c8._2_2_,CONCAT11(local_c8[1],local_c8[0])));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT17(uStack_d9,uStack_e0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uStack_d9,uStack_e0));
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&local_78._M_first);
  lVar2 = (longdouble)0;
  local_78._M_rest._M_first._M_storage = SUB101(lVar2,0);
  local_78._1_7_ = (undefined7)((unkuint10)lVar2 >> 8);
  local_78._8_2_ = (undefined2)((unkuint10)lVar2 >> 0x40);
  local_48 = 3;
  local_c8[0] = (Message)0x0;
  local_c8[1] = 0;
  local_c8._2_2_ = 0;
  local_a8._M_dataplus._M_p._0_1_ = (AssertHelper)0x0;
  local_a8._M_dataplus._M_p._1_1_ = 0;
  local_a8._M_dataplus._M_p._2_2_ = 0;
  testing::internal::CmpHelperEQ<float,float>
            ((internal *)local_e8,"test_object__.get< float >()","float {}",(float *)local_c8,
             (float *)&local_a8);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if ((undefined8 *)CONCAT17(uStack_d9,uStack_e0) == (undefined8 *)0x0) {
      pcVar21 = "";
    }
    else {
      pcVar21 = *(char **)CONCAT17(uStack_d9,uStack_e0);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x15f,pcVar21);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    plVar4 = (long *)CONCAT44(local_c8._4_4_,
                              CONCAT22(local_c8._2_2_,CONCAT11(local_c8[1],local_c8[0])));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT17(uStack_d9,uStack_e0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uStack_d9,uStack_e0));
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&local_78._M_first);
  lVar2 = (longdouble)0;
  local_78._M_rest._M_first._M_storage = SUB101(lVar2,0);
  local_78._1_7_ = (undefined7)((unkuint10)lVar2 >> 8);
  local_78._8_2_ = (undefined2)((unkuint10)lVar2 >> 0x40);
  local_48 = 3;
  local_c8[0] = (Message)0x0;
  local_c8[1] = 0;
  local_c8._2_2_ = 0;
  local_c8._4_4_ = 0;
  local_a8._M_dataplus._M_p._0_1_ = (AssertHelper)0x0;
  local_a8._M_dataplus._M_p._1_1_ = 0;
  local_a8._M_dataplus._M_p._2_2_ = 0;
  local_a8._M_dataplus._M_p._4_4_ = 0;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_e8,"test_object__.get< double >()","double {}",(double *)local_c8,
             (double *)&local_a8);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if ((undefined8 *)CONCAT17(uStack_d9,uStack_e0) == (undefined8 *)0x0) {
      pcVar21 = "";
    }
    else {
      pcVar21 = *(char **)CONCAT17(uStack_d9,uStack_e0);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x160,pcVar21);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    plVar4 = (long *)CONCAT44(local_c8._4_4_,
                              CONCAT22(local_c8._2_2_,CONCAT11(local_c8[1],local_c8[0])));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT17(uStack_d9,uStack_e0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uStack_d9,uStack_e0));
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&local_78._M_first);
  lVar2 = (longdouble)0;
  local_78._M_rest._M_first._M_storage = SUB101(lVar2,0);
  local_78._1_7_ = (undefined7)((unkuint10)lVar2 >> 8);
  local_78._8_2_ = (undefined2)((unkuint10)lVar2 >> 0x40);
  local_48 = 3;
  local_c8[1] = (undefined1)((unkuint10)lVar2 >> 8);
  local_c8._2_2_ = (undefined2)((unkuint10)lVar2 >> 0x10);
  local_c8._4_4_ = (undefined4)((unkuint10)lVar2 >> 0x20);
  local_c8[0] = local_78._M_rest._0_1_;
  uStack_c0 = local_78._8_2_;
  local_a8._M_dataplus._M_p._0_1_ = local_78._M_rest._0_1_;
  local_a8._M_dataplus._M_p._1_1_ = local_c8[1];
  local_a8._M_dataplus._M_p._2_2_ = local_c8._2_2_;
  local_a8._M_dataplus._M_p._4_4_ = local_c8._4_4_;
  local_a8._M_string_length._0_2_ = local_78._8_2_;
  testing::internal::CmpHelperEQ<long_double,long_double>
            ((internal *)local_e8,"test_object__.get< long_double_t >()","long_double_t {}",
             (longdouble *)local_c8,(longdouble *)&local_a8);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if ((undefined8 *)CONCAT17(uStack_d9,uStack_e0) == (undefined8 *)0x0) {
      pcVar21 = "";
    }
    else {
      pcVar21 = *(char **)CONCAT17(uStack_d9,uStack_e0);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x161,pcVar21);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    plVar4 = (long *)CONCAT44(local_c8._4_4_,
                              CONCAT22(local_c8._2_2_,CONCAT11(local_c8[1],local_c8[0])));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT17(uStack_d9,uStack_e0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uStack_d9,uStack_e0));
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&local_78._M_first);
  uStack_e0 = CONCAT52(uStack_be,uStack_c0);
  local_e8._1_6_ =
       (undefined6)
       (CONCAT44(local_c8._4_4_,CONCAT22(local_c8._2_2_,CONCAT11(local_c8[1],local_c8[0]))) >> 8);
  local_e8[7] = SUB41(local_c8._4_4_,3);
  lVar1 = (long)&local_78 + 0x10;
  local_78._M_rest._M_first._M_storage = SUB81(lVar1,0);
  local_78._1_7_ = (undefined7)((ulong)lVar1 >> 8);
  local_78._16_1_ = 0;
  local_78._17_7_ = CONCAT61(local_e8._1_6_,local_c8[0]);
  local_78._24_1_ = local_e8[7];
  local_78._8_2_ = 0;
  local_78._10_6_ = 0;
  local_48 = '\x04';
  local_c8[0] = SUB81(&local_b8,0);
  MVar13 = (Message)local_c8[0];
  local_c8[1] = (undefined1)((ulong)&local_b8 >> 8);
  uVar14 = local_c8[1];
  local_c8._2_2_ = (undefined2)((ulong)&local_b8 >> 0x10);
  uVar15 = local_c8._2_2_;
  local_c8._4_4_ = (undefined4)((ulong)&local_b8 >> 0x20);
  uVar16 = local_c8._4_4_;
  uStack_c0 = 0;
  uStack_be = 0;
  uStack_b9 = 0;
  local_b8 = (pointer)((ulong)local_b8 & 0xffffffffffffff00);
  local_e8[0] = SUB81(&local_d8,0);
  iVar10 = local_e8[0];
  local_e8._1_6_ = (undefined6)((ulong)&local_d8 >> 8);
  uVar11 = local_e8._1_6_;
  local_e8[7] = (undefined1)((ulong)&local_d8 >> 0x38);
  uVar12 = local_e8[7];
  local_78._25_7_ = uStack_e0;
  std::__cxx11::u8string::_M_construct<char8_t*>((u8string *)local_e8,lVar1);
  paVar5 = &local_a8.field_2;
  local_a8._M_dataplus._M_p._0_1_ = SUB81(paVar5,0);
  AVar17 = (AssertHelper)local_a8._M_dataplus._M_p._0_1_;
  local_a8._M_dataplus._M_p._1_1_ = (undefined1)((ulong)paVar5 >> 8);
  uVar18 = local_a8._M_dataplus._M_p._1_1_;
  local_a8._M_dataplus._M_p._2_2_ = (undefined2)((ulong)paVar5 >> 0x10);
  uVar19 = local_a8._M_dataplus._M_p._2_2_;
  local_a8._M_dataplus._M_p._4_4_ = (undefined4)((ulong)paVar5 >> 0x20);
  uVar20 = local_a8._M_dataplus._M_p._4_4_;
  local_a8._M_string_length._0_2_ = 0;
  local_a8._M_string_length._2_6_ = 0;
  local_a8.field_2._M_allocated_capacity =
       local_a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
  testing::internal::CmpHelperEQ<std::__cxx11::u8string,std::__cxx11::u8string>
            (local_88,"test_object__.get< std::u8string >()","std::u8string {}",
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_e8,
             &local_a8);
  puVar8 = (undefined1 *)
           CONCAT44(local_a8._M_dataplus._M_p._4_4_,
                    CONCAT22(local_a8._M_dataplus._M_p._2_2_,
                             CONCAT11(local_a8._M_dataplus._M_p._1_1_,
                                      local_a8._M_dataplus._M_p._0_1_)));
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)puVar8 != paVar5) {
    operator_delete(puVar8,local_a8.field_2._M_allocated_capacity + 1);
  }
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
            *)CONCAT17(local_e8[7],CONCAT61(local_e8._1_6_,local_e8[0]));
  if (paVar3 != &local_d8) {
    operator_delete(paVar3,(ulong)(local_d8._M_allocated_capacity + 1));
  }
  ppoVar6 = (pointer *)
            CONCAT44(local_c8._4_4_,CONCAT22(local_c8._2_2_,CONCAT11(local_c8[1],local_c8[0])));
  if (ppoVar6 != &local_b8) {
    operator_delete(ppoVar6,(ulong)((long)&(local_b8->m_value).
                                           super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                                           .
                                           super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                                           .
                                           super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                                           .
                                           super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                                           .
                                           super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                                           .
                                           super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                                   + 1));
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_e8);
    if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar21 = "";
    }
    else {
      pcVar21 = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x162,pcVar21);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c8,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c8);
    plVar4 = (long *)CONCAT17(local_e8[7],CONCAT61(local_e8._1_6_,local_e8[0]));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&local_78._M_first);
  local_e8[0] = (internal)0x0;
  local_e8._1_6_ = 0;
  local_e8[7] = 0;
  uStack_e0 = 0;
  uStack_d9 = 0;
  local_d8._M_allocated_capacity = 0;
  jessilib::object::
  object<std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_nullptr>
            ((object *)&local_78._M_first,
             (vector<jessilib::object,_std::allocator<jessilib::object>_> *)local_e8);
  std::vector<jessilib::object,_std::allocator<jessilib::object>_>::~vector
            ((vector<jessilib::object,_std::allocator<jessilib::object>_> *)local_e8);
  local_c8[0] = local_48 == '\x06';
  uStack_c0 = 0;
  uStack_be = 0;
  uStack_b9 = 0;
  if (!(bool)local_c8[0]) {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_e8,local_c8,"test_object__ .has< object::array_type >()",
               "false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x163,(char *)CONCAT17(local_e8[7],CONCAT61(local_e8._1_6_,local_e8[0])));
    testing::internal::AssertHelper::operator=((AssertHelper *)local_88,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_88);
    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
              *)CONCAT17(local_e8[7],CONCAT61(local_e8._1_6_,local_e8[0]));
    if (paVar3 != &local_d8) {
      operator_delete(paVar3,(ulong)(local_d8._M_allocated_capacity + 1));
    }
    plVar4 = (long *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,
                              CONCAT22(local_a8._M_dataplus._M_p._2_2_,
                                       CONCAT11(local_a8._M_dataplus._M_p._1_1_,
                                                local_a8._M_dataplus._M_p._0_1_)));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(uStack_b9,CONCAT52(uStack_be,uStack_c0));
    if (pbVar7 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&uStack_c0,pbVar7);
    }
  }
  local_c8[0] = (Message)0x0;
  local_c8[1] = 0;
  local_c8._2_2_ = 0;
  local_c8._4_4_ = 0;
  uStack_c0 = 0;
  uStack_be = 0;
  uStack_b9 = 0;
  local_b8 = (pointer)0x0;
  if (local_48 == '\x06') {
    std::vector<jessilib::object,_std::allocator<jessilib::object>_>::vector
              ((vector<jessilib::object,_std::allocator<jessilib::object>_> *)local_e8,
               (vector<jessilib::object,_std::allocator<jessilib::object>_> *)&local_78._M_first);
  }
  else {
    local_e8[0] = (internal)0x0;
    local_e8._1_6_ = 0;
    local_e8[7] = 0;
    uStack_e0 = 0;
    uStack_d9 = 0;
    local_d8._M_allocated_capacity = 0;
    local_c8[0] = (Message)0x0;
    local_c8[1] = 0;
    local_c8._2_2_ = 0;
    local_c8._4_4_ = 0;
    uStack_c0 = 0;
    uStack_be = 0;
    uStack_b9 = 0;
    local_b8 = (pointer)0x0;
  }
  local_a8._M_dataplus._M_p._0_1_ = (AssertHelper)0x0;
  local_a8._M_dataplus._M_p._1_1_ = 0;
  local_a8._M_dataplus._M_p._2_2_ = 0;
  local_a8._M_dataplus._M_p._4_4_ = 0;
  local_a8._M_string_length._0_2_ = 0;
  local_a8._M_string_length._2_6_ = 0;
  local_a8.field_2._M_allocated_capacity = 0;
  testing::internal::
  CmpHelperEQ<std::vector<jessilib::object,std::allocator<jessilib::object>>,std::vector<jessilib::object,std::allocator<jessilib::object>>>
            (local_88,"test_object__.get< object::array_type >()","object::array_type {}",
             (vector<jessilib::object,_std::allocator<jessilib::object>_> *)local_e8,
             (vector<jessilib::object,_std::allocator<jessilib::object>_> *)&local_a8);
  std::vector<jessilib::object,_std::allocator<jessilib::object>_>::~vector
            ((vector<jessilib::object,_std::allocator<jessilib::object>_> *)&local_a8);
  std::vector<jessilib::object,_std::allocator<jessilib::object>_>::~vector
            ((vector<jessilib::object,_std::allocator<jessilib::object>_> *)local_e8);
  std::vector<jessilib::object,_std::allocator<jessilib::object>_>::~vector
            ((vector<jessilib::object,_std::allocator<jessilib::object>_> *)local_c8);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_e8);
    if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar21 = "";
    }
    else {
      pcVar21 = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x163,pcVar21);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c8,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c8);
    plVar4 = (long *)CONCAT17(local_e8[7],CONCAT61(local_e8._1_6_,local_e8[0]));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&local_78._M_first);
  pcVar21 = "";
  jessilib::object::object((object *)&local_78._M_first,"");
  local_c8[0] = local_48 == '\x04';
  uStack_c0 = 0;
  uStack_be = 0;
  uStack_b9 = 0;
  if (!(bool)local_c8[0]) {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_e8,local_c8,"obj.has<std::u8string>()","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x168,(char *)CONCAT17(local_e8[7],CONCAT61(local_e8._1_6_,local_e8[0])));
    testing::internal::AssertHelper::operator=((AssertHelper *)local_88,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_88);
    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
              *)CONCAT17(local_e8[7],CONCAT61(local_e8._1_6_,local_e8[0]));
    if (paVar3 != &local_d8) {
      operator_delete(paVar3,(ulong)(local_d8._M_allocated_capacity + 1));
    }
    plVar4 = (long *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,
                              CONCAT22(local_a8._M_dataplus._M_p._2_2_,
                                       CONCAT11(local_a8._M_dataplus._M_p._1_1_,
                                                local_a8._M_dataplus._M_p._0_1_)));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(uStack_b9,CONCAT52(uStack_be,uStack_c0));
    if (pbVar7 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&uStack_c0,pbVar7);
    }
  }
  uStack_c0 = 0;
  uStack_be = 0;
  uStack_b9 = 0;
  uVar9 = (ulong)local_b8 >> 8;
  local_b8 = (pointer)(uVar9 << 8);
  local_e8[0] = iVar10;
  local_e8._1_6_ = uVar11;
  local_e8[7] = uVar12;
  local_c8[0] = MVar13;
  local_c8[1] = uVar14;
  local_c8._2_2_ = uVar15;
  local_c8._4_4_ = uVar16;
  if (local_48 == '\x04') {
    std::__cxx11::u8string::_M_construct<char8_t*>
              ((u8string *)local_e8,CONCAT71(local_78._1_7_,local_78._M_rest._M_first._M_storage),
               CONCAT62(local_78._10_6_,local_78._8_2_) +
               CONCAT71(local_78._1_7_,local_78._M_rest._M_first._M_storage));
  }
  else {
    local_d8._M_allocated_capacity = (size_type)local_b8;
    local_d8._8_8_ = uStack_b0;
    uStack_e0 = 0;
    uStack_d9 = 0;
    uStack_c0 = 0;
    uStack_be = 0;
    uStack_b9 = 0;
    local_b8 = (pointer)(uVar9 << 8);
  }
  local_a8._M_string_length._0_2_ = 0;
  local_a8._M_string_length._2_6_ = 0;
  local_a8.field_2._M_allocated_capacity =
       local_a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_a8._M_dataplus._M_p._0_1_ = AVar17;
  local_a8._M_dataplus._M_p._1_1_ = uVar18;
  local_a8._M_dataplus._M_p._2_2_ = uVar19;
  local_a8._M_dataplus._M_p._4_4_ = uVar20;
  testing::internal::CmpHelperEQ<std::__cxx11::u8string,std::__cxx11::u8string>
            (local_88,"obj.get<std::u8string>()","std::u8string{}",
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_e8,
             &local_a8);
  puVar8 = (undefined1 *)
           CONCAT44(local_a8._M_dataplus._M_p._4_4_,
                    CONCAT22(local_a8._M_dataplus._M_p._2_2_,
                             CONCAT11(local_a8._M_dataplus._M_p._1_1_,
                                      local_a8._M_dataplus._M_p._0_1_)));
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)puVar8 != paVar5) {
    operator_delete(puVar8,local_a8.field_2._M_allocated_capacity + 1);
  }
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
            *)CONCAT17(local_e8[7],CONCAT61(local_e8._1_6_,local_e8[0]));
  if (paVar3 != &local_d8) {
    operator_delete(paVar3,(ulong)(local_d8._M_allocated_capacity + 1));
  }
  ppoVar6 = (pointer *)
            CONCAT44(local_c8._4_4_,CONCAT22(local_c8._2_2_,CONCAT11(local_c8[1],local_c8[0])));
  if (ppoVar6 != &local_b8) {
    operator_delete(ppoVar6,(ulong)((long)&(local_b8->m_value).
                                           super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                                           .
                                           super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                                           .
                                           super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                                           .
                                           super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                                           .
                                           super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                                           .
                                           super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                                   + 1));
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_e8);
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar21 = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x169,pcVar21);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c8,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c8);
    plVar4 = (long *)CONCAT17(local_e8[7],CONCAT61(local_e8._1_6_,local_e8[0]));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&local_78._M_first);
  local_e8[0] = (internal)0x0;
  local_e8._1_6_ = 0;
  local_e8[7] = 0;
  pcVar21 = "";
  uStack_e0 = 0x486773;
  uStack_d9 = 0;
  jessilib::object::object((object *)&local_78._M_first,local_e8);
  local_c8[0] = local_48 == '\x04';
  uStack_c0 = 0;
  uStack_be = 0;
  uStack_b9 = 0;
  if (!(bool)local_c8[0]) {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_e8,local_c8,"obj.has<std::u8string>()","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x16f,(char *)CONCAT17(local_e8[7],CONCAT61(local_e8._1_6_,local_e8[0])));
    testing::internal::AssertHelper::operator=((AssertHelper *)local_88,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_88);
    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
              *)CONCAT17(local_e8[7],CONCAT61(local_e8._1_6_,local_e8[0]));
    if (paVar3 != &local_d8) {
      operator_delete(paVar3,(ulong)(local_d8._M_allocated_capacity + 1));
    }
    plVar4 = (long *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,
                              CONCAT22(local_a8._M_dataplus._M_p._2_2_,
                                       CONCAT11(local_a8._M_dataplus._M_p._1_1_,
                                                local_a8._M_dataplus._M_p._0_1_)));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(uStack_b9,CONCAT52(uStack_be,uStack_c0));
    if (pbVar7 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&uStack_c0,pbVar7);
    }
  }
  uStack_c0 = 0;
  uStack_be = 0;
  uStack_b9 = 0;
  uVar9 = (ulong)local_b8 >> 8;
  local_b8 = (pointer)(uVar9 << 8);
  if (local_48 == '\x04') {
    local_e8[0] = iVar10;
    local_e8._1_6_ = uVar11;
    local_e8[7] = uVar12;
    local_c8[0] = MVar13;
    local_c8[1] = uVar14;
    local_c8._2_2_ = uVar15;
    local_c8._4_4_ = uVar16;
    std::__cxx11::u8string::_M_construct<char8_t*>
              ((u8string *)local_e8,CONCAT71(local_78._1_7_,local_78._M_rest._M_first._M_storage),
               CONCAT62(local_78._10_6_,local_78._8_2_) +
               CONCAT71(local_78._1_7_,local_78._M_rest._M_first._M_storage));
  }
  else {
    local_d8._M_allocated_capacity = (size_type)local_b8;
    local_d8._8_8_ = uStack_b0;
    uStack_e0 = 0;
    uStack_d9 = 0;
    uStack_c0 = 0;
    uStack_be = 0;
    uStack_b9 = 0;
    local_b8 = (pointer)(uVar9 << 8);
    local_e8[0] = iVar10;
    local_e8._1_6_ = uVar11;
    local_e8[7] = uVar12;
    local_c8[0] = MVar13;
    local_c8[1] = uVar14;
    local_c8._2_2_ = uVar15;
    local_c8._4_4_ = uVar16;
  }
  local_a8._M_string_length._0_2_ = 0;
  local_a8._M_string_length._2_6_ = 0;
  local_a8.field_2._M_allocated_capacity =
       local_a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_a8._M_dataplus._M_p._0_1_ = AVar17;
  local_a8._M_dataplus._M_p._1_1_ = uVar18;
  local_a8._M_dataplus._M_p._2_2_ = uVar19;
  local_a8._M_dataplus._M_p._4_4_ = uVar20;
  testing::internal::CmpHelperEQ<std::__cxx11::u8string,std::__cxx11::u8string>
            (local_88,"obj.get<std::u8string>()","std::u8string{}",
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_e8,
             &local_a8);
  puVar8 = (undefined1 *)
           CONCAT44(local_a8._M_dataplus._M_p._4_4_,
                    CONCAT22(local_a8._M_dataplus._M_p._2_2_,
                             CONCAT11(local_a8._M_dataplus._M_p._1_1_,
                                      local_a8._M_dataplus._M_p._0_1_)));
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)puVar8 != paVar5) {
    operator_delete(puVar8,local_a8.field_2._M_allocated_capacity + 1);
  }
  paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
            *)CONCAT17(local_e8[7],CONCAT61(local_e8._1_6_,local_e8[0]));
  if (paVar5 != &local_d8) {
    operator_delete(paVar5,(ulong)(local_d8._M_allocated_capacity + 1));
  }
  ppoVar6 = (pointer *)
            CONCAT44(local_c8._4_4_,CONCAT22(local_c8._2_2_,CONCAT11(local_c8[1],local_c8[0])));
  if (ppoVar6 != &local_b8) {
    operator_delete(ppoVar6,(ulong)((long)&(local_b8->m_value).
                                           super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                                           .
                                           super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                                           .
                                           super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                                           .
                                           super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                                           .
                                           super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                                           .
                                           super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                                   + 1));
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_e8);
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar21 = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x170,pcVar21);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c8,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c8);
    plVar4 = (long *)CONCAT17(local_e8[7],CONCAT61(local_e8._1_6_,local_e8[0]));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&local_78._M_first);
  return;
}

Assistant:

TEST(ObjectTest, basic_value_constructor) {
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(bool);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(signed_char_t);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(unsigned_char_t);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(short);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(int);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(long);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(long_long_t);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(intmax_t);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(float);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(double);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(long_double_t);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::u8string);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(object::array_type);

	// const char*
	{
		object obj{ u8"" };
		EXPECT_TRUE(obj.has<std::u8string>());
		EXPECT_EQ(obj.get<std::u8string>(), std::u8string{});
	}

	// std::u8string_view
	{
		object obj{ u8""sv };
		EXPECT_TRUE(obj.has<std::u8string>());
		EXPECT_EQ(obj.get<std::u8string>(), std::u8string{});
	}
}